

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

string * __thiscall
QByteArray::toStdString_abi_cxx11_(string *__return_storage_ptr__,QByteArray *this)

{
  long lVar1;
  char *pcVar2;
  
  pcVar2 = (this->d).ptr;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = &_empty;
  }
  lVar1 = (this->d).size;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string QByteArray::toStdString() const
{
    return std::string(data(), size_t(size()));
}